

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O3

void __thiscall Assimp::Q3BSPFileParser::getLightMaps(Q3BSPFileParser *this)

{
  Q3BSPModel *pQVar1;
  sQ3BSPLightmap *__s;
  long lVar2;
  ulong uVar3;
  
  pQVar1 = this->m_pModel;
  if (pQVar1 != (Q3BSPModel *)0x0) {
    if ((pQVar1->m_Lightmaps).
        super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pQVar1->m_Lightmaps).
        super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar2 = (long)(pQVar1->m_Lumps).
                    super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[0xe]->iOffset;
      uVar3 = 0;
      do {
        __s = (sQ3BSPLightmap *)operator_new(0xc000);
        memset(__s,0,0xc000);
        memcpy(__s,(this->m_Data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar2,0xc000);
        lVar2 = lVar2 + 0xc000;
        (pQVar1->m_Lightmaps).
        super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar3] = __s;
        uVar3 = uVar3 + 1;
        pQVar1 = this->m_pModel;
      } while (uVar3 < (ulong)((long)(pQVar1->m_Lightmaps).
                                     super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pQVar1->m_Lightmaps).
                                     super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    return;
  }
  __assert_fail("nullptr != m_pModel",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Q3BSP/Q3BSPFileParser.cpp"
                ,0xf8,"void Assimp::Q3BSPFileParser::getLightMaps()");
}

Assistant:

void Q3BSPFileParser::getLightMaps()
{
    ai_assert(nullptr != m_pModel );

    size_t Offset = m_pModel->m_Lumps[kLightmaps]->iOffset;
    for ( size_t idx=0; idx < m_pModel->m_Lightmaps.size(); idx++ )
    {
        sQ3BSPLightmap *pLightmap = new sQ3BSPLightmap;
        memcpy( pLightmap, &m_Data[ Offset ], sizeof( sQ3BSPLightmap ) );
        Offset += sizeof( sQ3BSPLightmap );
        m_pModel->m_Lightmaps[ idx ] = pLightmap;
    }
}